

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void check_labels(c2m_ctx_t c2m_ctx,node_t_conflict labels,node_t_conflict target)

{
  check_ctx *pcVar1;
  type *type_00;
  int iVar2;
  node_t_conflict id_00;
  case_t_conflict before;
  code *pcVar3;
  case_t_conflict elem;
  char *pcVar4;
  bool bVar5;
  pos_t pVar6;
  bool local_111;
  node_t_conflict local_100;
  node_t_conflict local_f8;
  char *local_e0;
  undefined8 local_d8;
  char *local_d0;
  undefined8 local_c8;
  uint local_bc;
  int default_p;
  int ok_p;
  case_t_conflict tail;
  case_t_conflict case_attr;
  node_t_conflict case_expr2;
  node_t_conflict case_expr;
  type *type;
  switch_attr *switch_attr;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  node_t_conflict id;
  symbol_t sym;
  node_t_conflict l;
  check_ctx_t check_ctx;
  node_t_conflict target_local;
  node_t_conflict labels_local;
  c2m_ctx_t c2m_ctx_local;
  
  pcVar1 = c2m_ctx->check_ctx;
  for (sym.defs = (VARR_node_t *)DLIST_node_t_head(&(labels->u).ops); sym.defs != (VARR_node_t *)0x0
      ; sym.defs = (VARR_node_t *)DLIST_node_t_next((node_t_conflict)sym.defs)) {
    if ((int)(sym.defs)->els_num == 0x52) {
      id_00 = DLIST_node_t_head((DLIST_node_t *)&sym.defs[1].size);
      iVar2 = symbol_find(c2m_ctx,S_LABEL,id_00,pcVar1->func_block_scope,(symbol_t *)&id);
      if (iVar2 == 0) {
        symbol_insert(c2m_ctx,S_LABEL,id_00,pcVar1->func_block_scope,target,(node_t_conflict)0x0);
      }
      else {
        pVar6 = get_node_pos(c2m_ctx,id_00);
        local_78 = pVar6.fname;
        local_70 = pVar6._8_8_;
        error(c2m_ctx,0x1d6d34,local_78,local_70,(id_00->u).s.s);
      }
    }
    else if (pcVar1->curr_switch == (node_t_conflict)0x0) {
      pVar6 = get_node_pos(c2m_ctx,(node_t_conflict)sym.defs);
      pcVar4 = "default label";
      if ((int)(sym.defs)->els_num == 0x50) {
        pcVar4 = "case label";
      }
      switch_attr = (switch_attr *)pVar6.fname;
      local_80 = pVar6._8_8_;
      error(c2m_ctx,0x1d6d4b,(char *)switch_attr,local_80,pcVar4);
    }
    else {
      type_00 = (type *)pcVar1->curr_switch->attr;
      if ((int)(sym.defs)->els_num == 0x50) {
        local_f8 = DLIST_node_t_head((DLIST_node_t *)&sym.defs[1].size);
      }
      else {
        local_f8 = (node_t_conflict)0x0;
      }
      if ((int)(sym.defs)->els_num == 0x50) {
        local_100 = DLIST_node_t_el((DLIST_node_t *)&sym.defs[1].size,1);
      }
      else {
        local_100 = (node_t_conflict)0x0;
      }
      before = DLIST_case_t_tail((DLIST_case_t *)&type_00[1].mode);
      bVar5 = false;
      if (before != (case_t_conflict)0x0) {
        bVar5 = before->case_node->code == N_DEFAULT;
      }
      if (local_f8 == (node_t_conflict)0x0) {
        if (bVar5) {
          pVar6 = get_node_pos(c2m_ctx,(node_t_conflict)sym.defs);
          local_d0 = pVar6.fname;
          local_c8 = pVar6._8_8_;
          error(c2m_ctx,0x1d6d80,local_d0,local_c8);
        }
        local_bc = (uint)!bVar5;
      }
      else {
        local_bc = check_case_expr(c2m_ctx,local_f8,type_00,target);
        if (local_100 != (node_t_conflict)0x0) {
          iVar2 = check_case_expr(c2m_ctx,local_100,type_00,target);
          local_111 = iVar2 != 0 && local_bc != 0;
          local_bc = (uint)local_111;
          pcVar3 = warning;
          if (c2m_ctx->options->pedantic_p != 0) {
            pcVar3 = error;
          }
          pVar6 = get_node_pos(c2m_ctx,(node_t_conflict)sym.defs);
          local_e0 = pVar6.fname;
          local_d8 = pVar6._8_8_;
          (*pcVar3)(c2m_ctx,local_e0,local_d8,"range cases are not a part of C standard");
        }
      }
      if (local_bc != 0) {
        elem = (case_t_conflict)reg_malloc(c2m_ctx,0x20);
        elem->case_node = (node_t_conflict)sym.defs;
        elem->case_target_node = target;
        if (bVar5) {
          DLIST_case_t_insert_before((DLIST_case_t *)&type_00[1].mode,before,elem);
        }
        else {
          DLIST_case_t_append((DLIST_case_t *)&type_00[1].mode,elem);
        }
      }
    }
  }
  return;
}

Assistant:

static void check_labels (c2m_ctx_t c2m_ctx, node_t labels, node_t target) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;

  for (node_t l = NL_HEAD (labels->u.ops); l != NULL; l = NL_NEXT (l)) {
    if (l->code == N_LABEL) {
      symbol_t sym;
      node_t id = NL_HEAD (l->u.ops);

      if (symbol_find (c2m_ctx, S_LABEL, id, func_block_scope, &sym)) {
        error (c2m_ctx, POS (id), "label %s redeclaration", id->u.s.s);
      } else {
        symbol_insert (c2m_ctx, S_LABEL, id, func_block_scope, target, NULL);
      }
    } else if (curr_switch == NULL) {
      error (c2m_ctx, POS (l), "%s not within a switch-stmt",
             l->code == N_CASE ? "case label" : "default label");
    } else {
      struct switch_attr *switch_attr = curr_switch->attr;
      struct type *type = &switch_attr->type;
      node_t case_expr = l->code == N_CASE ? NL_HEAD (l->u.ops) : NULL;
      node_t case_expr2 = l->code == N_CASE ? NL_EL (l->u.ops, 1) : NULL;
      case_t case_attr, tail = DLIST_TAIL (case_t, switch_attr->case_labels);
      int ok_p = FALSE, default_p = tail != NULL && tail->case_node->code == N_DEFAULT;

      if (case_expr == NULL) {
        if (default_p) {
          error (c2m_ctx, POS (l), "multiple default labels in one switch");
        } else {
          ok_p = TRUE;
        }
      } else {
        ok_p = check_case_expr (c2m_ctx, case_expr, type, target);
        if (case_expr2 != NULL) {
          ok_p = check_case_expr (c2m_ctx, case_expr2, type, target) && ok_p;
          (c2m_options->pedantic_p ? error : warning) (c2m_ctx, POS (l),
                                                       "range cases are not a part of C standard");
        }
      }
      if (ok_p) {
        case_attr = reg_malloc (c2m_ctx, sizeof (struct case_attr));
        case_attr->case_node = l;
        case_attr->case_target_node = target;
        if (default_p) {
          DLIST_INSERT_BEFORE (case_t, switch_attr->case_labels, tail, case_attr);
        } else {
          DLIST_APPEND (case_t, switch_attr->case_labels, case_attr);
        }
      }
    }
  }
}